

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreConstruct.cpp
# Opt level: O1

expression * mathCore::imply(expression *a,expression *b)

{
  expression *this;
  expSet *this_00;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar1;
  _Alloc_node __an;
  key_type local_38;
  key_type local_30;
  _Alloc_node local_28;
  
  this = (expression *)operator_new(0x38);
  expression::expression(this);
  this->FLAGS = 0x80;
  this_00 = &this->contents;
  pVar1 = std::
          _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
          ::_M_get_insert_equal_pos(&this_00->_M_t,&local_30);
  local_28._M_t = &this_00->_M_t;
  std::
  _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
  ::
  _M_insert_<expression*const&,std::_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>::_Alloc_node>
            ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
              *)this_00,pVar1.first,pVar1.second,&local_30,&local_28);
  pVar1 = std::
          _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
          ::_M_get_insert_equal_pos(&this_00->_M_t,&local_38);
  local_28._M_t = &this_00->_M_t;
  std::
  _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
  ::
  _M_insert_<expression*const&,std::_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>::_Alloc_node>
            ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
              *)this_00,pVar1.first,pVar1.second,&local_38,&local_28);
  return this;
}

Assistant:

expression* mathCore::imply(expression* a, expression* b) {
	expression* exp = new expression;
	exp->FLAGS = F_IMPLY;
	exp->contents.insert(a);
	exp->contents.insert(b);
	return exp;
}